

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::SetProperty
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  byte bVar1;
  Type TVar2;
  ScriptContext *scriptContext;
  code *pcVar3;
  Var value_00;
  bool bVar4;
  BOOL BVar5;
  uint index_00;
  undefined4 *puVar6;
  undefined4 in_register_00000084;
  uint32 local_54;
  Var pvStack_50;
  uint32 indexVal;
  undefined8 local_48;
  Type *local_40;
  ushort local_32 [4];
  PropertyIndex index;
  
  local_48 = CONCAT44(in_register_00000084,flags);
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  pvStack_50 = value;
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId,scriptContext);
  BVar5 = GetDescriptor(this,propertyId,local_32);
  if (BVar5 == 0) {
    BVar5 = ScriptContext::IsNumericPropertyId(scriptContext,propertyId,&local_54);
    if (BVar5 == 0) {
      BVar5 = AddProperty(this,instance,propertyId,pvStack_50,'\a',info,
                          (PropertyOperationFlags)local_48,SideEffects_Any);
    }
    else {
      BVar5 = DynamicTypeHandler::SetItem
                        (&this->super_DynamicTypeHandler,instance,local_54,pvStack_50,
                         (PropertyOperationFlags)local_48);
    }
  }
  else {
    local_40 = this->descriptors;
    index_00 = (uint)local_32[0];
    bVar1 = this->descriptors[local_32[0]].field_1.Attributes;
    if ((bVar1 & 8) == 0) {
      if ((bVar1 & 4) == 0) {
        JavascriptError::ThrowCantAssignIfStrictMode((PropertyOperationFlags)local_48,scriptContext)
        ;
        if (info == (PropertyValueInfo *)0x0) {
          return 0;
        }
        TVar2 = local_40[local_32[0]].field_1.Attributes;
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = local_32[0];
        info->m_attributes = TVar2;
        info->flags = InlineCacheNoFlags;
        return 0;
      }
    }
    else {
      if (((this->super_DynamicTypeHandler).flags & 4) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x23a,"(!GetIsLocked())","!GetIsLocked()");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
        index_00 = (uint)local_32[0];
      }
      *(undefined1 *)((long)&local_40->field_1 + (ulong)(index_00 << 4)) = 7;
      DynamicObject::SetHasNoEnumerableProperties(instance,false);
      index_00 = (uint)local_32[0];
    }
    value_00 = pvStack_50;
    DynamicTypeHandler::SetSlotUnchecked(instance,index_00,pvStack_50);
    if (info != (PropertyValueInfo *)0x0) {
      TVar2 = local_40[local_32[0]].field_1.Attributes;
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = local_32[0];
      info->m_attributes = TVar2;
      info->flags = InlineCacheNoFlags;
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,value_00,SideEffects_Any);
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyIndex index;

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, scriptContext);

        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                // A locked type should not have deleted properties
                Assert(!GetIsLocked());
                descriptors[index].Attributes = PropertyDynamicTypeDefaults;
                instance->SetHasNoEnumerableProperties(false);
            }
            else if (!(descriptors[index].Attributes & PropertyWritable))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes); // Try to cache property info even if not writable
                return false;
            }

            SetSlotUnchecked(instance, index, value);
            PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes);
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
            return true;
        }

        // Always check numeric propertyId. This may create objectArray.
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItem(instance, indexVal, value, flags);
        }

        return this->AddProperty(instance, propertyId, value, PropertyDynamicTypeDefaults, info, flags, SideEffects_Any);
    }